

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

bool slang::ast::Bitstream::canBeTarget
               (StreamingConcatenationExpression *lhs,Expression *rhs,SourceRange assignmentRange,
               ASTContext *context)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  Diagnostic *this;
  StreamingConcatenationExpression *pSVar4;
  Expression *in_RSI;
  StreamingConcatenationExpression *in_RDI;
  Diagnostic *diag;
  StreamingConcatenationExpression *source;
  bool good;
  uint64_t sourceWidth;
  uint64_t targetWidth;
  SourceRange *with;
  SourceRange *dynamic;
  BitstreamSizeMode in_stack_00000124;
  StreamingConcatenationExpression *in_stack_00000128;
  string *in_stack_fffffffffffffe88;
  Diagnostic *in_stack_fffffffffffffe90;
  SourceLocation in_stack_fffffffffffffe98;
  SourceLocation in_stack_fffffffffffffea0;
  ASTContext *in_stack_fffffffffffffea8;
  SourceLocation in_stack_fffffffffffffeb0;
  SourceLocation in_stack_fffffffffffffeb8;
  SourceRange **in_stack_fffffffffffffec0;
  DiagCode code;
  StreamingConcatenationExpression *in_stack_fffffffffffffec8;
  Type *in_stack_fffffffffffffed8;
  Diagnostic *in_stack_fffffffffffffee0;
  Type *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  SourceLocation in_stack_fffffffffffffef8;
  StreamingConcatenationExpression *in_stack_ffffffffffffff00;
  StreamingConcatenationExpression *in_stack_ffffffffffffff08;
  bool local_b1;
  bool local_1;
  
  if (in_RSI->kind != Streaming) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x5c40e1);
    bVar1 = Type::isBitstreamType((Type *)in_stack_fffffffffffffef8,(bool)in_stack_fffffffffffffef7)
    ;
    if (!bVar1) {
      sourceRange.endLoc = in_stack_fffffffffffffeb8;
      sourceRange.startLoc = in_stack_fffffffffffffeb0;
      ASTContext::addDiag(in_stack_fffffffffffffea8,
                          SUB84((ulong)in_stack_fffffffffffffec0 >> 0x20,0),sourceRange);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x5c415a);
      ast::operator<<(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      range.endLoc = in_stack_fffffffffffffea0;
      range.startLoc = in_stack_fffffffffffffe98;
      Diagnostic::operator<<(in_stack_fffffffffffffe90,range);
      return false;
    }
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x5c41bd);
    sourceRange_02.startLoc._7_1_ = in_stack_fffffffffffffef7;
    sourceRange_02.startLoc._0_7_ = in_stack_fffffffffffffef0;
    sourceRange_02.endLoc = in_stack_fffffffffffffef8;
    bVar1 = checkClassAccess(in_stack_fffffffffffffee8,(ASTContext *)in_stack_fffffffffffffee0,
                             sourceRange_02);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = withAfterDynamic(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           (SourceRange **)in_stack_fffffffffffffeb8);
  code = SUB84((ulong)in_stack_fffffffffffffec0 >> 0x20,0);
  if (bVar1) {
    sourceRange_00.endLoc = in_stack_fffffffffffffeb8;
    sourceRange_00.startLoc = in_stack_fffffffffffffeb0;
    ASTContext::addDiag(in_stack_fffffffffffffea8,code,sourceRange_00);
    range_00.endLoc = in_stack_fffffffffffffea0;
    range_00.startLoc = in_stack_fffffffffffffe98;
    Diagnostic::operator<<(in_stack_fffffffffffffe90,range_00);
    local_1 = false;
  }
  else {
    bVar1 = ASTContext::inUnevaluatedBranch((ASTContext *)in_stack_fffffffffffffe90);
    if (bVar1) {
      local_1 = true;
    }
    else {
      uVar2 = StreamingConcatenationExpression::getBitstreamWidth(in_RDI);
      if (in_RSI->kind == Streaming) {
        pSVar4 = Expression::as<slang::ast::StreamingConcatenationExpression>(in_RSI);
        uVar3 = StreamingConcatenationExpression::getBitstreamWidth(pSVar4);
        bVar1 = StreamingConcatenationExpression::isFixedSize
                          ((StreamingConcatenationExpression *)in_stack_fffffffffffffeb8);
        if ((bVar1) &&
           (bVar1 = StreamingConcatenationExpression::isFixedSize
                              ((StreamingConcatenationExpression *)in_stack_fffffffffffffeb8), bVar1
           )) {
          local_b1 = uVar2 == uVar3;
        }
        else {
          local_b1 = dynamicSizesMatch<slang::ast::StreamingConcatenationExpression,slang::ast::StreamingConcatenationExpression>
                               (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        }
      }
      else {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x5c433d);
        bVar1 = Type::isFixedSize(in_stack_fffffffffffffed8);
        if (!bVar1) {
          return true;
        }
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x5c4367);
        uVar3 = Type::getBitstreamWidth((Type *)in_stack_fffffffffffffe98);
        local_b1 = uVar2 <= uVar3;
      }
      if (local_b1 == false) {
        sourceRange_01.endLoc = in_stack_fffffffffffffeb8;
        sourceRange_01.startLoc = in_stack_fffffffffffffeb0;
        this = ASTContext::addDiag(in_stack_fffffffffffffea8,code,sourceRange_01);
        if (in_RSI->kind == Streaming) {
          in_stack_fffffffffffffe98 = (SourceLocation)&stack0xffffffffffffff00;
          formatWidth<slang::ast::StreamingConcatenationExpression>
                    (in_stack_00000128,in_stack_00000124);
          in_stack_fffffffffffffea0 =
               (SourceLocation)Diagnostic::operator<<(this,in_stack_fffffffffffffe88);
          pSVar4 = Expression::as<slang::ast::StreamingConcatenationExpression>(in_RSI);
          formatWidth<slang::ast::StreamingConcatenationExpression>
                    (in_stack_00000128,in_stack_00000124);
          Diagnostic::operator<<(this,(string *)pSVar4);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        }
        else {
          Diagnostic::operator<<<unsigned_long>
                    ((Diagnostic *)in_stack_fffffffffffffea0,
                     (unsigned_long)in_stack_fffffffffffffe98);
          Diagnostic::operator<<<unsigned_long>
                    ((Diagnostic *)in_stack_fffffffffffffea0,
                     (unsigned_long)in_stack_fffffffffffffe98);
          this = in_stack_fffffffffffffe90;
        }
        range_01.endLoc = in_stack_fffffffffffffea0;
        range_01.startLoc = in_stack_fffffffffffffe98;
        Diagnostic::operator<<(this,range_01);
        if (in_RSI->kind == Streaming) {
          range_02.endLoc = in_stack_fffffffffffffea0;
          range_02.startLoc = in_stack_fffffffffffffe98;
          Diagnostic::operator<<(this,range_02);
        }
      }
      local_1 = local_b1;
    }
  }
  return local_1;
}

Assistant:

bool Bitstream::canBeTarget(const StreamingConcatenationExpression& lhs, const Expression& rhs,
                            SourceRange assignmentRange, const ASTContext& context) {
    if (rhs.kind != ExpressionKind::Streaming) {
        if (!rhs.type->isBitstreamType()) {
            context.addDiag(diag::BadStreamSourceType, assignmentRange)
                << *rhs.type << lhs.sourceRange;
            return false;
        }

        if (!checkClassAccess(*rhs.type, context, rhs.sourceRange))
            return false;
    }

    const SourceRange *dynamic = nullptr, *with = nullptr;
    if (withAfterDynamic(lhs, dynamic, with)) {
        context.addDiag(diag::BadStreamWithOrder, *with) << *dynamic;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch

    uint64_t targetWidth = lhs.getBitstreamWidth();
    uint64_t sourceWidth;
    bool good = true;

    if (rhs.kind != ExpressionKind::Streaming) {
        if (!rhs.type->isFixedSize())
            return true; // Sizes checked at constant evaluation or runtime

        sourceWidth = rhs.type->getBitstreamWidth();
        good = targetWidth <= sourceWidth;
    }
    else {
        auto& source = rhs.as<StreamingConcatenationExpression>();
        sourceWidth = source.getBitstreamWidth();
        if (lhs.isFixedSize() && source.isFixedSize())
            good = targetWidth == sourceWidth;
        else
            good = dynamicSizesMatch(lhs, source);
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignmentRange);
        if (rhs.kind != ExpressionKind::Streaming)
            diag << targetWidth << sourceWidth;
        else {
            diag << formatWidth(lhs, BitstreamSizeMode::DestFill)
                 << formatWidth(rhs.as<StreamingConcatenationExpression>(),
                                BitstreamSizeMode::Source);
        }

        diag << lhs.sourceRange;
        if (rhs.kind == ExpressionKind::Streaming)
            diag << rhs.sourceRange;
    }

    return good;
}